

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

string * __thiscall
cmMakefileTargetGenerator::CreateResponseFile
          (string *__return_storage_ptr__,cmMakefileTargetGenerator *this,string *name,
          string *options,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makefile_depends,string *language)

{
  cmMakefile *this_00;
  bool bVar1;
  Encoding encoding;
  ostream *poVar2;
  char local_2c1;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_2c0;
  string responseFileNameFull;
  cmGeneratedFileStream responseStream;
  
  local_2c0 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)makefile_depends;
  encoding = (*(this->GlobalGenerator->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
               _vptr_cmGlobalGenerator[5])();
  if (encoding == UTF8_WITH_BOM) {
    bVar1 = std::operator==(language,"CUDA");
    if (!bVar1) {
      this_00 = (this->super_cmCommonTargetGenerator).Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&responseStream,"MSVC",(allocator<char> *)&responseFileNameFull);
      bVar1 = cmMakefile::IsOn(this_00,(string *)&responseStream);
      std::__cxx11::string::~string((string *)&responseStream);
      if (bVar1) {
        encoding = UTF8_WITH_BOM;
        goto LAB_0048d749;
      }
    }
    encoding = UTF8;
  }
LAB_0048d749:
  responseStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
  _vptr_basic_ostream._0_1_ = 0x2f;
  cmStrCat<std::__cxx11::string&,char,std::__cxx11::string_const&>
            (&responseFileNameFull,&this->TargetBuildDirectoryFull,(char *)&responseStream,name);
  cmGeneratedFileStream::cmGeneratedFileStream(&responseStream,&responseFileNameFull,false,encoding)
  ;
  cmGeneratedFileStream::SetCopyIfDifferent(&responseStream,true);
  poVar2 = std::operator<<((ostream *)&responseStream,(string *)options);
  std::operator<<(poVar2,"\n");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>(local_2c0,&responseFileNameFull);
  local_2c1 = '/';
  cmStrCat<std::__cxx11::string&,char,std::__cxx11::string_const&>
            (__return_storage_ptr__,&this->TargetBuildDirectory,&local_2c1,name);
  cmGeneratedFileStream::~cmGeneratedFileStream(&responseStream);
  std::__cxx11::string::~string((string *)&responseFileNameFull);
  return __return_storage_ptr__;
}

Assistant:

std::string cmMakefileTargetGenerator::CreateResponseFile(
  const std::string& name, std::string const& options,
  std::vector<std::string>& makefile_depends, std::string const& language)
{
  // FIXME: Find a better way to determine the response file encoding,
  // perhaps using tool-specific platform information variables.
  // For now, use the makefile encoding as a heuristic.
  codecvt_Encoding responseEncoding =
    this->GlobalGenerator->GetMakefileEncoding();
  // Non-MSVC tooling doesn't understand BOM encoded files.
  if (responseEncoding == codecvt_Encoding::UTF8_WITH_BOM &&
      (language == "CUDA" || !this->Makefile->IsOn("MSVC"))) {
    responseEncoding = codecvt_Encoding::UTF8;
  }

  // Create the response file.
  std::string responseFileNameFull =
    cmStrCat(this->TargetBuildDirectoryFull, '/', name);
  cmGeneratedFileStream responseStream(responseFileNameFull, false,
                                       responseEncoding);
  responseStream.SetCopyIfDifferent(true);
  responseStream << options << "\n";

  // Add a dependency so the target will rebuild when the set of
  // objects changes.
  makefile_depends.push_back(std::move(responseFileNameFull));

  // Construct the name to be used on the command line.
  std::string responseFileName =
    cmStrCat(this->TargetBuildDirectory, '/', name);
  return responseFileName;
}